

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Sweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Dch_ManSetDefaultParams((Dch_Pars_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_00265cce:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WCStvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Sweep(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManBoxNum(pAbc->pGia);
      if ((iVar1 != 0) && (pAbc->pGia->pAigExtra == (Gia_Man_t *)0x0)) {
        printf("Timing manager is given but there is no GIA of boxes.\n");
        return 0;
      }
      iVar1 = Gia_ManBoxNum(pAbc->pGia);
      if (iVar1 == 0) {
        Pars._56_8_ = Gia_ManFraigSweepSimple(pAbc->pGia,(Dch_Pars_t *)&pPars);
      }
      else {
        Pars._56_8_ = Gia_ManSweepWithBoxes
                                (pAbc->pGia,(Dch_Pars_t *)&pPars,(void *)0x0,0,0,Pars.fLightSynth,0)
        ;
      }
      Abc_FrameUpdateGia(pAbc,(Gia_Man_t *)Pars._56_8_);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00265f75;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = pPars._4_4_;
      break;
    default:
      goto LAB_00265f75;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_00265f75;
      }
      Pars.nWords = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nWords;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_00265f75;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = (uint)pPars;
      break;
    case 0x68:
      goto LAB_00265f75;
    case 0x74:
      Pars.fSynthesis = Pars.fSynthesis ^ 1;
      goto LAB_00265cce;
    case 0x76:
      Pars.fLightSynth = Pars.fLightSynth ^ 1;
      goto LAB_00265cce;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_00265f75:
      Abc_Print(-2,"usage: &sweep [-WCS num] [-tvh]\n");
      Abc_Print(-2,"\t         performs SAT sweeping for AIG with boxes\n");
      Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      pcVar3 = "no";
      if (Pars.fSynthesis != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fLightSynth != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c;
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCStvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sweep(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && pAbc->pGia->pAigExtra == NULL )
    {
        printf( "Timing manager is given but there is no GIA of boxes.\n" );
        return 0;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) )
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, pPars, NULL, 0, 0, pPars->fVerbose, 0 );
    else
        pTemp = Gia_ManFraigSweepSimple( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &sweep [-WCS num] [-tvh]\n" );
    Abc_Print( -2, "\t         performs SAT sweeping for AIG with boxes\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}